

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_glow.cpp
# Opt level: O3

void gl_InitGlow(FScanner *sc)

{
  undefined1 *puVar1;
  bool bVar2;
  FTextureID FVar3;
  uint32 uVar4;
  FTexture *pFVar5;
  
  FScanner::MustGetStringName(sc,"{");
  bVar2 = FScanner::CheckString(sc,"}");
  do {
    if (bVar2) {
      return;
    }
    FScanner::MustGetString(sc);
    bVar2 = FScanner::Compare(sc,"FLATS");
    if (bVar2) {
      FScanner::MustGetStringName(sc,"{");
      while (bVar2 = FScanner::CheckString(sc,"}"), !bVar2) {
        FScanner::MustGetString(sc);
        FVar3 = FTextureManager::CheckForTexture(&TexMan,sc->String,2,1);
        if (((uint)FVar3.texnum < TexMan.Textures.Count) &&
           (TexMan.Textures.Array[FVar3.texnum].Texture != (FTexture *)0x0)) {
          puVar1 = &((TexMan.Textures.Array[FVar3.texnum].Texture)->gl_info).field_0x4c;
          *puVar1 = *puVar1 | 0xc;
        }
      }
    }
    else {
      bVar2 = FScanner::Compare(sc,"WALLS");
      if (bVar2) {
        FScanner::MustGetStringName(sc,"{");
        while (bVar2 = FScanner::CheckString(sc,"}"), !bVar2) {
          FScanner::MustGetString(sc);
          FVar3 = FTextureManager::CheckForTexture(&TexMan,sc->String,1,1);
          if (((uint)FVar3.texnum < TexMan.Textures.Count) &&
             (TexMan.Textures.Array[FVar3.texnum].Texture != (FTexture *)0x0)) {
            puVar1 = &((TexMan.Textures.Array[FVar3.texnum].Texture)->gl_info).field_0x4c;
            *puVar1 = *puVar1 | 0xc;
          }
        }
      }
      else {
        bVar2 = FScanner::Compare(sc,"TEXTURE");
        if (bVar2) {
          FScanner::SetCMode(sc,true);
          FScanner::MustGetString(sc);
          FVar3 = FTextureManager::CheckForTexture(&TexMan,sc->String,2,1);
          if ((uint)FVar3.texnum < TexMan.Textures.Count) {
            pFVar5 = TexMan.Textures.Array[FVar3.texnum].Texture;
          }
          else {
            pFVar5 = (FTexture *)0x0;
          }
          FScanner::MustGetStringName(sc,",");
          FScanner::MustGetString(sc);
          uVar4 = V_GetColor((DWORD *)0x0,sc->String);
          bVar2 = FScanner::CheckString(sc,",");
          if (bVar2) {
            bVar2 = FScanner::CheckNumber(sc);
            if (bVar2) {
              if (pFVar5 != (FTexture *)0x0) {
                (pFVar5->gl_info).GlowHeight = sc->Number;
              }
              bVar2 = FScanner::CheckString(sc,",");
              if (!bVar2) goto LAB_0047f8c9;
            }
            FScanner::MustGetStringName(sc,"fullbright");
            if (pFVar5 == (FTexture *)0x0) {
              FScanner::SetCMode(sc,false);
            }
            else {
              puVar1 = &(pFVar5->gl_info).field_0x4c;
              *puVar1 = *puVar1 | 8;
              FScanner::SetCMode(sc,false);
              if (uVar4 != 0) goto LAB_0047f8e2;
            }
          }
          else {
LAB_0047f8c9:
            FScanner::SetCMode(sc,false);
            if (uVar4 != 0 && pFVar5 != (FTexture *)0x0) {
LAB_0047f8e2:
              puVar1 = &(pFVar5->gl_info).field_0x4c;
              *puVar1 = *puVar1 | 4;
              (pFVar5->gl_info).GlowColor.field_0.d = uVar4;
            }
          }
        }
      }
    }
    bVar2 = FScanner::CheckString(sc,"}");
  } while( true );
}

Assistant:

void gl_InitGlow(FScanner &sc)
{
	sc.MustGetStringName("{");
	while (!sc.CheckString("}"))
	{
		sc.MustGetString();
		if (sc.Compare("FLATS"))
		{
			sc.MustGetStringName("{");
			while (!sc.CheckString("}"))
			{
				sc.MustGetString();
				FTextureID flump=TexMan.CheckForTexture(sc.String, FTexture::TEX_Flat,FTextureManager::TEXMAN_TryAny);
				FTexture *tex = TexMan[flump];
				if (tex) tex->gl_info.bGlowing = tex->gl_info.bFullbright = true;
			}
		}
		else if (sc.Compare("WALLS"))
		{
			sc.MustGetStringName("{");
			while (!sc.CheckString("}"))
			{
				sc.MustGetString();
				FTextureID flump=TexMan.CheckForTexture(sc.String, FTexture::TEX_Wall,FTextureManager::TEXMAN_TryAny);
				FTexture *tex = TexMan[flump];
				if (tex) tex->gl_info.bGlowing = tex->gl_info.bFullbright = true;
			}
		}
		else if (sc.Compare("TEXTURE"))
		{
			sc.SetCMode(true);
			sc.MustGetString();
			FTextureID flump=TexMan.CheckForTexture(sc.String, FTexture::TEX_Flat,FTextureManager::TEXMAN_TryAny);
			FTexture *tex = TexMan[flump];
			sc.MustGetStringName(",");
			sc.MustGetString();
			PalEntry color = V_GetColor(NULL, sc.String);
			//sc.MustGetStringName(",");
			//sc.MustGetNumber();
			if (sc.CheckString(","))
			{
				if (sc.CheckNumber())
				{
					if (tex) tex->gl_info.GlowHeight = sc.Number;
					if (!sc.CheckString(",")) goto skip_fb;
				}

				sc.MustGetStringName("fullbright");
				if (tex) tex->gl_info.bFullbright = true;
			}
		skip_fb:
			sc.SetCMode(false);

			if (tex && color != 0)
			{
				tex->gl_info.bGlowing = true;
				tex->gl_info.GlowColor = color;
			}
		}
	}
}